

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::
newAdaptedPromise<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom,kj::(anonymous_namespace)::AsyncPipe&,kj::AsyncInputStream&,unsigned_long&>
          (kj *this,AsyncPipe *adapterConstructorParams,AsyncInputStream *adapterConstructorParams_1
          ,unsigned_long *adapterConstructorParams_2)

{
  AsyncPipe *params;
  AsyncInputStream *params_1;
  unsigned_long *params_2;
  PromiseNode *extraout_RDX;
  Promise<unsigned_long> PVar1;
  Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom>_>
  local_48;
  Own<kj::_::PromiseNode> local_38;
  unsigned_long *local_28;
  unsigned_long *adapterConstructorParams_local_2;
  AsyncInputStream *adapterConstructorParams_local_1;
  AsyncPipe *adapterConstructorParams_local;
  
  local_28 = adapterConstructorParams_2;
  adapterConstructorParams_local_2 = (unsigned_long *)adapterConstructorParams_1;
  adapterConstructorParams_local_1 = (AsyncInputStream *)adapterConstructorParams;
  adapterConstructorParams_local = (AsyncPipe *)this;
  params = fwd<kj::(anonymous_namespace)::AsyncPipe&>(adapterConstructorParams);
  params_1 = fwd<kj::AsyncInputStream&>((AsyncInputStream *)adapterConstructorParams_local_2);
  params_2 = fwd<unsigned_long&>(local_28);
  heap<kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom>,kj::(anonymous_namespace)::AsyncPipe&,kj::AsyncInputStream&,unsigned_long&>
            ((kj *)&local_48,params,params_1,params_2);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom>,void>
            (&local_38,&local_48);
  Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,false,&local_38);
  Own<kj::_::PromiseNode>::~Own(&local_38);
  Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom>_>
  ::~Own(&local_48);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> newAdaptedPromise(Params&&... adapterConstructorParams) {
  return Promise<T>(false, heap<_::AdapterPromiseNode<_::FixVoid<T>, Adapter>>(
      kj::fwd<Params>(adapterConstructorParams)...));
}